

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithmeticSubtermGeneralization.cpp
# Opt level: O1

FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
* __thiscall
Inferences::
FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
::meet(FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
       *__return_storage_ptr__,
      FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
      *this,FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
            *rhs)

{
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
  *pDVar1;
  AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral> AStack_58;
  AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral> local_34;
  
  if (((undefined1  [40])
       ((undefined1  [40])
        (this->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
        .
        super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
       & (undefined1  [40])0x1) == (undefined1  [40])0x0) &&
     ((undefined1  [40])
      ((undefined1  [40])
       (rhs->_inner)._inner.
       super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
       .
       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
       .
       super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
      & (undefined1  [40])0x1) == (undefined1  [40])0x0)) {
    ::Lib::CoproductImpl::TrivialOperations::CopyCons::
    DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
    ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
                   *)&local_34,
                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
                   *)(this->_inner)._inner.
                     super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                     .
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                     .
                     super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                     ._content);
    ::Lib::CoproductImpl::TrivialOperations::CopyCons::
    DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
    ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
                   *)&AStack_58,
                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
                   *)(rhs->_inner)._inner.
                     super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                     .
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                     .
                     super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                     ._content);
    meet(__return_storage_ptr__,&local_34,&AStack_58);
    ::Lib::CoproductImpl::TrivialOperations::Destr::
    DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
    ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                    *)&AStack_58);
    ::Lib::CoproductImpl::TrivialOperations::Destr::
    DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
    ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                    *)&local_34);
  }
  else {
    *(undefined8 *)
     &(__return_storage_ptr__->_inner)._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
      .
      super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
         = 0;
    pDVar1 = &(__return_storage_ptr__->_inner)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
    ;
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[7] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[8] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[9] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[10] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0xb] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0xc] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0xd] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0xe] = '\0';
    pDVar1 = &(__return_storage_ptr__->_inner)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
    ;
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0xf] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0x10] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0x11] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0x12] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0x13] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0x14] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0x15] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0x16] = '\0';
    pDVar1 = &(__return_storage_ptr__->_inner)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
    ;
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0x17] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0x18] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0x19] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0x1a] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0x1b] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0x1c] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0x1d] = '\0';
    (pDVar1->
    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
    )._content[0x1e] = '\0';
    *(undefined8 *)
     ((__return_storage_ptr__->_inner)._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
      .
      super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
      ._content + 0x1f) = 0;
    *(undefined1 *)
     &(__return_storage_ptr__->_inner)._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
      .
      super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
         = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

FlatMeetLattice meet(FlatMeetLattice rhs) 
  {
    auto& lhs = *this;

    if (lhs._inner.template is<Bot>()) return bot();
    if (rhs._inner.template is<Bot>()) return bot();

    return meet(lhs._inner.template unwrap<A>(), rhs._inner.template unwrap<A>());
  }